

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::TcpSocketEngine::Connect
          (TcpSocketEngine *this,HostAddress *address,uint16_t port)

{
  bool bVar1;
  uint16_t in_DX;
  TcpSocketEngine *in_RDI;
  uint16_t in_stack_0000002e;
  HostAddress *in_stack_00000030;
  TcpSocketEngine *in_stack_00000038;
  undefined6 in_stack_ffffffffffffffe0;
  bool local_1;
  
  bVar1 = IsValid(in_RDI);
  if ((bVar1) && (in_RDI->m_socketState != ConnectedState)) {
    bVar1 = nativeConnect(in_stack_00000038,in_stack_00000030,in_stack_0000002e);
    if (bVar1) {
      HostAddress::operator=
                ((HostAddress *)CONCAT26(in_DX,in_stack_ffffffffffffffe0),(HostAddress *)in_RDI);
      in_RDI->m_remotePort = in_DX;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TcpSocketEngine::Connect(const HostAddress& address, const uint16_t port)
{

    // return failure if invalid FD or already connected
    if (!IsValid() || (m_socketState == TcpSocket::ConnectedState)) {
        // TODO: set error string
        return false;
    }

    // attempt to connect to host address on requested port
    if (!nativeConnect(address, port)) {
        // TODO: set error string
        return false;
    }

    // if successful, store remote host address port & return success
    // TODO: (later) fetch proxied remote & local host/port  here
    m_remoteAddress = address;
    m_remotePort = port;
    return true;
}